

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

void __thiscall BCLog::Logger::ShrinkDebugFile(Logger *this)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  ulong uVar4;
  Logger *pLVar5;
  size_t sVar6;
  path *__filename;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view str;
  vector<char,_std::allocator<char>_> vch;
  string local_60;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_file_path).super_path._M_pathname._M_string_length == 0) {
    __assert_fail("!m_file_path.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/logging.cpp"
                  ,0x1d9,"void BCLog::Logger::ShrinkDebugFile()");
  }
  __filename = &this->m_file_path;
  __stream = fsbridge::fopen((char *)__filename,"r");
  uVar4 = std::filesystem::file_size((path *)__filename);
  if ((__stream == (FILE *)0x0) || (uVar4 < 0xa7d8c1)) {
    if (__stream != (FILE *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        fclose(__stream);
        return;
      }
      goto LAB_003847dd;
    }
  }
  else {
    log_msg._M_dataplus._M_p = log_msg._M_dataplus._M_p & 0xffffffffffffff00;
    std::vector<char,_std::allocator<char>_>::vector
              (&vch,10000000,(value_type *)&log_msg,(allocator_type *)&local_60);
    iVar3 = fseek(__stream,(long)vch.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start -
                           (long)vch.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_finish,2);
    if (iVar3 == 0) {
      sVar6 = fread(vch.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,1,
                    (long)vch.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)vch.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,__stream);
      fclose(__stream);
      __stream = fsbridge::fopen((char *)__filename,"w");
      if (__stream != (FILE *)0x0) {
        fwrite(vch.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start,1,(long)(int)sVar6,__stream);
        goto LAB_003845cc;
      }
    }
    else {
      pLVar5 = LogInstance();
      bVar2 = Enabled(pLVar5);
      if (bVar2) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<>(&local_60,"Failed to shrink debug log file: fseek(...) failed\n");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        pLVar5 = LogInstance();
        local_60._M_dataplus._M_p = (pointer)0x54;
        local_60._M_string_length = 0x44011e;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/logging.cpp";
        source_file._M_len = 0x54;
        logging_function._M_str = "ShrinkDebugFile";
        logging_function._M_len = 0xf;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        LogPrintStr(pLVar5,str,logging_function,source_file,0x1eb,ALL,Info);
        std::__cxx11::string::~string((string *)&log_msg);
      }
LAB_003845cc:
      fclose(__stream);
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&vch.super__Vector_base<char,_std::allocator<char>_>);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_003847dd:
  __stack_chk_fail();
}

Assistant:

void BCLog::Logger::ShrinkDebugFile()
{
    // Amount of debug.log to save at end when shrinking (must fit in memory)
    constexpr size_t RECENT_DEBUG_HISTORY_SIZE = 10 * 1000000;

    assert(!m_file_path.empty());

    // Scroll debug.log if it's getting too big
    FILE* file = fsbridge::fopen(m_file_path, "r");

    // Special files (e.g. device nodes) may not have a size.
    size_t log_size = 0;
    try {
        log_size = fs::file_size(m_file_path);
    } catch (const fs::filesystem_error&) {}

    // If debug.log file is more than 10% bigger the RECENT_DEBUG_HISTORY_SIZE
    // trim it down by saving only the last RECENT_DEBUG_HISTORY_SIZE bytes
    if (file && log_size > 11 * (RECENT_DEBUG_HISTORY_SIZE / 10))
    {
        // Restart the file with some of the end
        std::vector<char> vch(RECENT_DEBUG_HISTORY_SIZE, 0);
        if (fseek(file, -((long)vch.size()), SEEK_END)) {
            LogPrintf("Failed to shrink debug log file: fseek(...) failed\n");
            fclose(file);
            return;
        }
        int nBytes = fread(vch.data(), 1, vch.size(), file);
        fclose(file);

        file = fsbridge::fopen(m_file_path, "w");
        if (file)
        {
            fwrite(vch.data(), 1, nBytes, file);
            fclose(file);
        }
    }
    else if (file != nullptr)
        fclose(file);
}